

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afshaper.c
# Opt level: O0

FT_Error af_shaper_get_coverage
                   (AF_FaceGlobals globals,AF_StyleClass style_class,FT_UShort *gstyles,
                   FT_Bool default_script)

{
  int iVar1;
  undefined8 uVar2;
  byte *pbVar3;
  FT_UInt local_a4;
  int local_a0;
  hb_codepoint_t gidx;
  FT_UInt len_;
  hb_codepoint_t ch;
  char *p;
  AF_Blue_StringRec *pAStack_88;
  FT_Bool found;
  AF_Blue_StringRec *bs;
  AF_Blue_Stringset bss;
  hb_codepoint_t idx;
  hb_tag_t script_tags [4];
  hb_tag_t *coverage_tags;
  undefined8 uStack_58;
  hb_script_t script;
  hb_set_t *gpos_glyphs;
  hb_set_t *gpos_lookups;
  hb_set_t *gsub_glyphs;
  hb_set_t *gsub_lookups;
  hb_face_t *face;
  FT_Bool default_script_local;
  FT_UShort *gstyles_local;
  AF_StyleClass style_class_local;
  AF_FaceGlobals globals_local;
  
  gsub_glyphs = (hb_set_t *)0x0;
  gpos_lookups = (hb_set_t *)0x0;
  gpos_glyphs = (hb_set_t *)0x0;
  uStack_58 = 0;
  memset(&bss,0,0x10);
  if (((globals == (AF_FaceGlobals)0x0) || (style_class == (AF_StyleClass)0x0)) ||
     (gstyles == (FT_UShort *)0x0)) {
    return 6;
  }
  uVar2 = hb_font_get_face(globals->hb_font);
  script_tags._8_8_ = coverages[style_class->coverage];
  hb_ot_tags_from_script(scripts[style_class->script],&bss,&idx);
  if (default_script == '\0') {
    if (bss == 0x44464c54) goto LAB_001c336b;
    if (idx == 0x44464c54) {
      idx = 0;
    }
  }
  else if (bss == AF_BLUE_STRINGSET_ADLM) {
    bss = 0x44464c54;
  }
  else if (idx == 0) {
    idx = 0x44464c54;
  }
  else if (idx != 0x44464c54) {
    script_tags[0] = 0x44464c54;
  }
  gsub_glyphs = (hb_set_t *)hb_set_create();
  hb_ot_layout_collect_lookups(uVar2,0x47535542,&bss,0,script_tags._8_8_,gsub_glyphs);
  iVar1 = hb_set_is_empty(gsub_glyphs);
  if (iVar1 == 0) {
    gpos_lookups = (hb_set_t *)hb_set_create();
    bs._4_4_ = 0xffffffff;
    while (iVar1 = hb_set_next(gsub_glyphs,(long)&bs + 4), iVar1 != 0) {
      hb_ot_layout_lookup_collect_glyphs(uVar2,0x47535542,bs._4_4_,0,0,0,gpos_lookups);
    }
    gpos_glyphs = (hb_set_t *)hb_set_create();
    hb_ot_layout_collect_lookups(uVar2,0x47504f53,&bss,0,script_tags._8_8_,gpos_glyphs);
    uStack_58 = hb_set_create();
    bs._4_4_ = 0xffffffff;
    while (iVar1 = hb_set_next(gpos_glyphs,(long)&bs + 4), iVar1 != 0) {
      hb_ot_layout_lookup_collect_glyphs(uVar2,0x47504f53,bs._4_4_,0,uStack_58,0,0);
    }
    if (style_class->coverage != AF_COVERAGE_DEFAULT) {
      bs._0_4_ = style_class->blue_stringset;
      p._7_1_ = '\0';
      for (pAStack_88 = af_blue_stringsets + (AF_Blue_Stringset)bs;
          pAStack_88->string != AF_BLUE_STRING_MAX; pAStack_88 = pAStack_88 + 1) {
        _len_ = (byte *)(af_blue_strings + pAStack_88->string);
LAB_001c3183:
        if (*_len_ != 0) {
          pbVar3 = _len_ + 1;
          gidx = (hb_codepoint_t)*_len_;
          _len_ = pbVar3;
          if (0x7f < gidx) {
            if (gidx < 0xe0) {
              local_a0 = 1;
              gidx = gidx & 0x1f;
            }
            else if (gidx < 0xf0) {
              local_a0 = 2;
              gidx = gidx & 0xf;
            }
            else {
              local_a0 = 3;
              gidx = gidx & 7;
            }
            for (; local_a0 != 0; local_a0 = local_a0 + -1) {
              gidx = gidx << 6 | (int)(char)*_len_ & 0x3fU;
              _len_ = _len_ + 1;
            }
          }
          bs._4_4_ = 0xffffffff;
          do {
            iVar1 = hb_set_next(gsub_glyphs,(long)&bs + 4);
            if (iVar1 == 0) goto LAB_001c3183;
            local_a4 = FT_Get_Char_Index(globals->face,(ulong)gidx);
            iVar1 = hb_ot_layout_lookup_would_substitute(uVar2,bs._4_4_,&local_a4,1);
          } while (iVar1 == 0);
          p._7_1_ = '\x01';
          goto LAB_001c3183;
        }
      }
      if (p._7_1_ == '\0') goto LAB_001c336b;
    }
    if (style_class->coverage != AF_COVERAGE_DEFAULT) {
      hb_set_subtract(gpos_lookups,uStack_58);
    }
    bs._4_4_ = 0xffffffff;
    while (iVar1 = hb_set_next(gpos_lookups,(long)&bs + 4), iVar1 != 0) {
      if ((bs._4_4_ < (uint)globals->glyph_count) && (gstyles[bs._4_4_] == 0x3fff)) {
        gstyles[bs._4_4_] = (FT_UShort)style_class->style;
      }
    }
  }
LAB_001c336b:
  hb_set_destroy(gsub_glyphs);
  hb_set_destroy(gpos_lookups);
  hb_set_destroy(gpos_glyphs);
  hb_set_destroy(uStack_58);
  return 0;
}

Assistant:

FT_Error
  af_shaper_get_coverage( AF_FaceGlobals  globals,
                          AF_StyleClass   style_class,
                          FT_UShort*      gstyles,
                          FT_Bool         default_script )
  {
    hb_face_t*  face;

    hb_set_t*  gsub_lookups = NULL; /* GSUB lookups for a given script */
    hb_set_t*  gsub_glyphs  = NULL; /* glyphs covered by GSUB lookups  */
    hb_set_t*  gpos_lookups = NULL; /* GPOS lookups for a given script */
    hb_set_t*  gpos_glyphs  = NULL; /* glyphs covered by GPOS lookups  */

    hb_script_t      script;
    const hb_tag_t*  coverage_tags;
    hb_tag_t         script_tags[] = { HB_TAG_NONE,
                                       HB_TAG_NONE,
                                       HB_TAG_NONE,
                                       HB_TAG_NONE };

    hb_codepoint_t  idx;
#ifdef FT_DEBUG_LEVEL_TRACE
    int             count;
#endif


    if ( !globals || !style_class || !gstyles )
      return FT_THROW( Invalid_Argument );

    face = hb_font_get_face( globals->hb_font );

    coverage_tags = coverages[style_class->coverage];
    script        = scripts[style_class->script];

    /* Convert a HarfBuzz script tag into the corresponding OpenType */
    /* tag or tags -- some Indic scripts like Devanagari have an old */
    /* and a new set of features.                                    */
    hb_ot_tags_from_script( script,
                            &script_tags[0],
                            &script_tags[1] );

    /* `hb_ot_tags_from_script' usually returns HB_OT_TAG_DEFAULT_SCRIPT */
    /* as the second tag.  We change that to HB_TAG_NONE except for the  */
    /* default script.                                                   */
    if ( default_script )
    {
      if ( script_tags[0] == HB_TAG_NONE )
        script_tags[0] = HB_OT_TAG_DEFAULT_SCRIPT;
      else
      {
        if ( script_tags[1] == HB_TAG_NONE )
          script_tags[1] = HB_OT_TAG_DEFAULT_SCRIPT;
        else if ( script_tags[1] != HB_OT_TAG_DEFAULT_SCRIPT )
          script_tags[2] = HB_OT_TAG_DEFAULT_SCRIPT;
      }
    }
    else
    {
      /* we use non-standard tags like `khms' for special purposes;       */
      /* HarfBuzz maps them to `DFLT', which we don't want to handle here */
      if ( script_tags[0] == HB_OT_TAG_DEFAULT_SCRIPT )
        goto Exit;

      if ( script_tags[1] == HB_OT_TAG_DEFAULT_SCRIPT )
        script_tags[1] = HB_TAG_NONE;
    }

    gsub_lookups = hb_set_create();
    hb_ot_layout_collect_lookups( face,
                                  HB_OT_TAG_GSUB,
                                  script_tags,
                                  NULL,
                                  coverage_tags,
                                  gsub_lookups );

    if ( hb_set_is_empty( gsub_lookups ) )
      goto Exit; /* nothing to do */

    FT_TRACE4(( "GSUB lookups (style `%s'):\n"
                " ",
                af_style_names[style_class->style] ));

#ifdef FT_DEBUG_LEVEL_TRACE
    count = 0;
#endif

    gsub_glyphs = hb_set_create();
    for ( idx = HB_SET_VALUE_INVALID; hb_set_next( gsub_lookups, &idx ); )
    {
#ifdef FT_DEBUG_LEVEL_TRACE
      FT_TRACE4(( " %d", idx ));
      count++;
#endif

      /* get output coverage of GSUB feature */
      hb_ot_layout_lookup_collect_glyphs( face,
                                          HB_OT_TAG_GSUB,
                                          idx,
                                          NULL,
                                          NULL,
                                          NULL,
                                          gsub_glyphs );
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !count )
      FT_TRACE4(( " (none)" ));
    FT_TRACE4(( "\n\n" ));
#endif

    FT_TRACE4(( "GPOS lookups (style `%s'):\n"
                " ",
                af_style_names[style_class->style] ));

    gpos_lookups = hb_set_create();
    hb_ot_layout_collect_lookups( face,
                                  HB_OT_TAG_GPOS,
                                  script_tags,
                                  NULL,
                                  coverage_tags,
                                  gpos_lookups );

#ifdef FT_DEBUG_LEVEL_TRACE
    count = 0;
#endif

    gpos_glyphs = hb_set_create();
    for ( idx = HB_SET_VALUE_INVALID; hb_set_next( gpos_lookups, &idx ); )
    {
#ifdef FT_DEBUG_LEVEL_TRACE
      FT_TRACE4(( " %d", idx ));
      count++;
#endif

      /* get input coverage of GPOS feature */
      hb_ot_layout_lookup_collect_glyphs( face,
                                          HB_OT_TAG_GPOS,
                                          idx,
                                          NULL,
                                          gpos_glyphs,
                                          NULL,
                                          NULL );
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !count )
      FT_TRACE4(( " (none)" ));
    FT_TRACE4(( "\n\n" ));
#endif

    /*
     * We now check whether we can construct blue zones, using glyphs
     * covered by the feature only.  In case there is not a single zone
     * (this is, not a single character is covered), we skip this coverage.
     *
     */
    if ( style_class->coverage != AF_COVERAGE_DEFAULT )
    {
      AF_Blue_Stringset         bss = style_class->blue_stringset;
      const AF_Blue_StringRec*  bs  = &af_blue_stringsets[bss];

      FT_Bool  found = 0;


      for ( ; bs->string != AF_BLUE_STRING_MAX; bs++ )
      {
        const char*  p = &af_blue_strings[bs->string];


        while ( *p )
        {
          hb_codepoint_t  ch;


          GET_UTF8_CHAR( ch, p );

          for ( idx = HB_SET_VALUE_INVALID; hb_set_next( gsub_lookups,
                                                         &idx ); )
          {
            hb_codepoint_t  gidx = FT_Get_Char_Index( globals->face, ch );


            if ( hb_ot_layout_lookup_would_substitute( face, idx,
                                                       &gidx, 1, 1 ) )
            {
              found = 1;
              break;
            }
          }
        }
      }

      if ( !found )
      {
        FT_TRACE4(( "  no blue characters found; style skipped\n" ));
        goto Exit;
      }
    }

    /*
     * Various OpenType features might use the same glyphs at different
     * vertical positions; for example, superscript and subscript glyphs
     * could be the same.  However, the auto-hinter is completely
     * agnostic of OpenType features after the feature analysis has been
     * completed: The engine then simply receives a glyph index and returns a
     * hinted and usually rendered glyph.
     *
     * Consider the superscript feature of font `pala.ttf': Some of the
     * glyphs are `real', this is, they have a zero vertical offset, but
     * most of them are small caps glyphs shifted up to the superscript
     * position (this is, the `sups' feature is present in both the GSUB and
     * GPOS tables).  The code for blue zones computation actually uses a
     * feature's y offset so that the `real' glyphs get correct hints.  But
     * later on it is impossible to decide whether a glyph index belongs to,
     * say, the small caps or superscript feature.
     *
     * For this reason, we don't assign a style to a glyph if the current
     * feature covers the glyph in both the GSUB and the GPOS tables.  This
     * is quite a broad condition, assuming that
     *
     *   (a) glyphs that get used in multiple features are present in a
     *       feature without vertical shift,
     *
     * and
     *
     *   (b) a feature's GPOS data really moves the glyph vertically.
     *
     * Not fulfilling condition (a) makes a font larger; it would also
     * reduce the number of glyphs that could be addressed directly without
     * using OpenType features, so this assumption is rather strong.
     *
     * Condition (b) is much weaker, and there might be glyphs which get
     * missed.  However, the OpenType features we are going to handle are
     * primarily located in GSUB, and HarfBuzz doesn't provide an API to
     * directly get the necessary information from the GPOS table.  A
     * possible solution might be to directly parse the GPOS table to find
     * out whether a glyph gets shifted vertically, but this is something I
     * would like to avoid if not really necessary.
     *
     * Note that we don't follow this logic for the default coverage.
     * Complex scripts like Devanagari have mandatory GPOS features to
     * position many glyph elements, using mark-to-base or mark-to-ligature
     * tables; the number of glyphs missed due to condition (b) would be far
     * too large.
     *
     */
    if ( style_class->coverage != AF_COVERAGE_DEFAULT )
      hb_set_subtract( gsub_glyphs, gpos_glyphs );

#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE4(( "  glyphs without GPOS data (`*' means already assigned)" ));
    count = 0;
#endif

    for ( idx = HB_SET_VALUE_INVALID; hb_set_next( gsub_glyphs, &idx ); )
    {
#ifdef FT_DEBUG_LEVEL_TRACE
      if ( !( count % 10 ) )
        FT_TRACE4(( "\n"
                    "   " ));

      FT_TRACE4(( " %d", idx ));
      count++;
#endif

      /* glyph indices returned by `hb_ot_layout_lookup_collect_glyphs' */
      /* can be arbitrary: some fonts use fake indices for processing   */
      /* internal to GSUB or GPOS, which is fully valid                 */
      if ( idx >= (hb_codepoint_t)globals->glyph_count )
        continue;

      if ( gstyles[idx] == AF_STYLE_UNASSIGNED )
        gstyles[idx] = (FT_UShort)style_class->style;
#ifdef FT_DEBUG_LEVEL_TRACE
      else
        FT_TRACE4(( "*" ));
#endif
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !count )
      FT_TRACE4(( "\n"
                  "    (none)" ));
    FT_TRACE4(( "\n\n" ));
#endif

  Exit:
    hb_set_destroy( gsub_lookups );
    hb_set_destroy( gsub_glyphs  );
    hb_set_destroy( gpos_lookups );
    hb_set_destroy( gpos_glyphs  );

    return FT_Err_Ok;
  }